

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewind-window.cc
# Opt level: O0

void __thiscall Debugger::RewindWindow::Tick(RewindWindow *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ImDrawList *this_00;
  bool bVar3;
  Bool BVar4;
  Ticks TVar5;
  ulong uVar6;
  Ticks TVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int local_360;
  int local_35c;
  int local_358;
  ImVec2 local_348;
  undefined1 local_340 [8];
  anon_class_40_5_a302e0d8 draw_bar;
  anon_class_24_3_8a65b60c xoffset;
  ImVec2 local_2f8;
  ImVec2 local_2f0;
  ImVec2 margin;
  ImVec2 local_2e0;
  ImVec2 br_pos;
  ImVec2 ul_pos;
  f32 h;
  f32 w;
  ImDrawList *draw_list;
  ImVec2 avail_size;
  ImVec2 cursor;
  f64 range;
  Ticks newest;
  Ticks oldest;
  undefined1 local_278 [32];
  undefined1 local_258 [32];
  undefined1 local_238 [32];
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [48];
  undefined1 local_168 [32];
  undefined1 local_148 [40];
  f64 sec;
  Ticks total_ticks;
  size_t capacity;
  size_t used;
  size_t uncompressed;
  size_t total;
  size_t diff;
  size_t base;
  RewindStats rw_stats;
  JoypadStats joyp_stats;
  int i;
  int count;
  Ticks rel_seek_cy;
  ImVec2 local_58;
  byte local_4d;
  int local_4c;
  bool reverse_step;
  int offset_cy;
  ImVec2 local_40;
  int local_38;
  int local_34;
  int frame;
  u32 range_fr;
  Ticks rel_cur_cy;
  Ticks oldest_cy;
  Ticks cur_cy;
  RewindWindow *pRStack_10;
  bool rewinding;
  RewindWindow *this_local;
  
  if (((this->super_Window).is_open & 1U) != 0) {
    pRStack_10 = this;
    bVar3 = ImGui::Begin("Rewind",&(this->super_Window).is_open,0);
    if (bVar3) {
      BVar4 = host_is_rewinding(((this->super_Window).d)->host);
      cur_cy._7_1_ = BVar4 != FALSE;
      bVar3 = ImGui::Checkbox("Rewind",(bool *)((long)&cur_cy + 7));
      if (bVar3) {
        if ((cur_cy._7_1_ & 1) == 0) {
          EndRewind((this->super_Window).d);
        }
        else {
          BeginRewind((this->super_Window).d);
        }
      }
      if ((cur_cy._7_1_ & 1) != 0) {
        oldest_cy = emulator_get_ticks(((this->super_Window).d)->e);
        rel_cur_cy = host_get_rewind_oldest_ticks(((this->super_Window).d)->host);
        _frame = oldest_cy - rel_cur_cy;
        TVar5 = host_newest_ticks(((this->super_Window).d)->host);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = TVar5 - rel_cur_cy;
        local_34 = SUB164(auVar1 / ZEXT816(0x11250),0);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = _frame;
        local_38 = SUB164(auVar2 / ZEXT816(0x11250),0);
        ImGui::PushButtonRepeat(true);
        ImVec2::ImVec2(&local_40,0.0,0.0);
        bVar3 = ImGui::Button("-1",&local_40);
        if (bVar3) {
          local_38 = local_38 + -1;
        }
        ImGui::SameLine(0.0,-1.0);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffb8,0.0,0.0);
        bVar3 = ImGui::Button("+1",(ImVec2 *)&stack0xffffffffffffffb8);
        if (bVar3) {
          local_38 = local_38 + 1;
        }
        ImGui::PopButtonRepeat();
        ImGui::SameLine(0.0,-1.0);
        ImGui::SliderInt("Frames",&local_38,0,local_34,"%d",0);
        if (local_38 < 0) {
          local_358 = 0;
        }
        else {
          local_358 = local_38;
        }
        if (local_34 < local_358) {
          local_35c = local_34;
        }
        else {
          if (local_38 < 0) {
            local_360 = 0;
          }
          else {
            local_360 = local_38;
          }
          local_35c = local_360;
        }
        local_38 = local_35c;
        local_4c = (int)(_frame % 0x11250);
        local_4d = 0;
        ImGui::PushButtonRepeat(true);
        ImVec2::ImVec2(&local_58,0.0,0.0);
        bVar3 = ImGui::Button("-I",&local_58);
        if (bVar3) {
          local_4c = local_4c + -0x1c;
          local_4d = 1;
        }
        ImGui::SameLine(0.0,-1.0);
        ImVec2::ImVec2((ImVec2 *)&rel_seek_cy,0.0,0.0);
        bVar3 = ImGui::Button("+I",(ImVec2 *)&rel_seek_cy);
        if (bVar3) {
          local_4c = local_4c + 1;
        }
        ImGui::PopButtonRepeat();
        ImGui::SameLine(0.0,-1.0);
        ImGui::SliderInt("Tick Offset",&local_4c,0,0x1124f,"%d",0);
        uVar6 = (long)local_38 * 0x11250 + (long)local_4c;
        if ((_frame != uVar6) &&
           (RewindTo((this->super_Window).d,rel_cur_cy + uVar6), (local_4d & 1) != 0)) {
          emulator_write_state(((this->super_Window).d)->e,&this->reverse_step_save_state);
          joyp_stats.capacity_bytes._4_4_ = 0;
          while (TVar5 = emulator_get_ticks(((this->super_Window).d)->e), TVar5 < oldest_cy) {
            emulator_step(((this->super_Window).d)->e);
            joyp_stats.capacity_bytes._4_4_ = joyp_stats.capacity_bytes._4_4_ + 1;
          }
          emulator_read_state(((this->super_Window).d)->e,&this->reverse_step_save_state);
          for (joyp_stats.capacity_bytes._0_4_ = 0;
              (int)joyp_stats.capacity_bytes < joyp_stats.capacity_bytes._4_4_ + -1;
              joyp_stats.capacity_bytes._0_4_ = (int)joyp_stats.capacity_bytes + 1) {
            emulator_step(((this->super_Window).d)->e);
          }
        }
      }
      ImGui::Separator();
      join_0x00000010_0x00000000_ = host_get_joypad_stats(((this->super_Window).d)->host);
      host_get_rewind_stats((RewindStats *)&base,((this->super_Window).d)->host);
      diff = base;
      total = rw_stats.base_bytes;
      uncompressed = base + rw_stats.base_bytes;
      used = rw_stats.diff_bytes;
      capacity = rw_stats.uncompressed_bytes;
      total_ticks = rw_stats.used_bytes;
      TVar5 = host_newest_ticks(((this->super_Window).d)->host);
      TVar7 = host_oldest_ticks(((this->super_Window).d)->host);
      sec = (f64)(TVar5 - TVar7);
      auVar13._8_4_ = (int)((ulong)sec >> 0x20);
      auVar13._0_8_ = sec;
      auVar13._12_4_ = 0x45300000;
      local_148._32_8_ =
           ((auVar13._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,SUB84(sec,0)) - 4503599627370496.0)) * 2.384185791015625e-07
      ;
      PrettySize_abi_cxx11_((Debugger *)local_148,rw_stats.info_ranges[3]);
      uVar8 = std::__cxx11::string::c_str();
      PrettySize_abi_cxx11_((Debugger *)local_168,joyp_stats.used_bytes);
      uVar9 = std::__cxx11::string::c_str();
      ImGui::Text("joypad used/capacity: %s/%s",uVar8,uVar9);
      std::__cxx11::string::~string((string *)local_168);
      std::__cxx11::string::~string((string *)local_148);
      PrettySize_abi_cxx11_((Debugger *)local_198,diff);
      uVar8 = std::__cxx11::string::c_str();
      PrettySize_abi_cxx11_((Debugger *)local_1b8,total);
      uVar9 = std::__cxx11::string::c_str();
      PrettySize_abi_cxx11_((Debugger *)local_1d8,uncompressed);
      uVar10 = std::__cxx11::string::c_str();
      auVar14._8_4_ = (int)(uncompressed >> 0x20);
      auVar14._0_8_ = uncompressed;
      auVar14._12_4_ = 0x45300000;
      auVar20._8_4_ = (int)(used >> 0x20);
      auVar20._0_8_ = used;
      auVar20._12_4_ = 0x45300000;
      ImGui::Text("rewind base/diff/total: %s/%s/%s (%.0f%%)",
                  (((auVar14._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uncompressed) - 4503599627370496.0)) * 100.0) /
                  ((auVar20._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)used) - 4503599627370496.0)),uVar8,uVar9,uVar10)
      ;
      std::__cxx11::string::~string((string *)local_1d8);
      std::__cxx11::string::~string((string *)local_1b8);
      std::__cxx11::string::~string((string *)local_198);
      PrettySize_abi_cxx11_((Debugger *)local_1f8,used);
      uVar8 = std::__cxx11::string::c_str();
      ImGui::Text("rewind uncomp: %s",uVar8);
      std::__cxx11::string::~string((string *)local_1f8);
      PrettySize_abi_cxx11_((Debugger *)local_218,capacity);
      uVar8 = std::__cxx11::string::c_str();
      PrettySize_abi_cxx11_((Debugger *)local_238,total_ticks);
      uVar9 = std::__cxx11::string::c_str();
      auVar15._8_4_ = (int)(capacity >> 0x20);
      auVar15._0_8_ = capacity;
      auVar15._12_4_ = 0x45300000;
      auVar21._8_4_ = (int)(total_ticks >> 0x20);
      auVar21._0_8_ = total_ticks;
      auVar21._12_4_ = 0x45300000;
      ImGui::Text("rewind used: %s/%s (%.0f%%)",
                  (((auVar15._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)capacity) - 4503599627370496.0)) * 100.0) /
                  ((auVar21._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)total_ticks) - 4503599627370496.0)),uVar8,uVar9)
      ;
      std::__cxx11::string::~string((string *)local_238);
      std::__cxx11::string::~string((string *)local_218);
      auVar16._8_4_ = (int)(uncompressed >> 0x20);
      auVar16._0_8_ = uncompressed;
      auVar16._12_4_ = 0x45300000;
      dVar12 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uncompressed) - 4503599627370496.0)) /
               (double)local_148._32_8_;
      uVar6 = (ulong)dVar12;
      PrettySize_abi_cxx11_
                ((Debugger *)local_258,
                 uVar6 | (long)(dVar12 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f);
      uVar8 = std::__cxx11::string::c_str();
      auVar17._8_4_ = (int)(uncompressed >> 0x20);
      auVar17._0_8_ = uncompressed;
      auVar17._12_4_ = 0x45300000;
      dVar12 = (((auVar17._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uncompressed) - 4503599627370496.0)) /
               (double)local_148._32_8_) * 60.0;
      uVar6 = (ulong)dVar12;
      PrettySize_abi_cxx11_
                ((Debugger *)local_278,
                 uVar6 | (long)(dVar12 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f);
      uVar9 = std::__cxx11::string::c_str();
      auVar18._8_4_ = (int)(uncompressed >> 0x20);
      auVar18._0_8_ = uncompressed;
      auVar18._12_4_ = 0x45300000;
      dVar12 = (((auVar18._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uncompressed) - 4503599627370496.0)) /
               (double)local_148._32_8_) * 60.0 * 60.0;
      uVar6 = (ulong)dVar12;
      PrettySize_abi_cxx11_
                ((Debugger *)&oldest,
                 uVar6 | (long)(dVar12 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f);
      uVar10 = std::__cxx11::string::c_str();
      ImGui::Text("rate: %s/sec %s/min %s/hr",uVar8,uVar9,uVar10);
      std::__cxx11::string::~string((string *)&oldest);
      std::__cxx11::string::~string((string *)local_278);
      std::__cxx11::string::~string((string *)local_258);
      TVar5 = host_get_rewind_oldest_ticks(((this->super_Window).d)->host);
      TVar7 = host_get_rewind_newest_ticks(((this->super_Window).d)->host);
      lVar11 = TVar7 - TVar5;
      auVar19._8_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar19._0_8_ = lVar11;
      auVar19._12_4_ = 0x45300000;
      ImGui::Text("range: [%lu..%lu] (%.0f sec)",
                  ((auVar19._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) *
                  2.384185791015625e-07,TVar5,TVar7);
      avail_size = ImGui::GetCursorScreenPos();
      draw_list = (ImDrawList *)ImGui::GetContentRegionAvail();
      _h = ImGui::GetWindowDrawList();
      ul_pos.y = draw_list._0_4_;
      ul_pos.x = 64.0;
      br_pos = avail_size;
      ImVec2::ImVec2(&margin,draw_list._0_4_,64.0);
      local_2e0 = operator+(&br_pos,&margin);
      ImVec2::ImVec2(&local_2f0,4.0,4.0);
      ImDrawList::AddRectFilled(_h,&br_pos,&local_2e0,0xff000000,0.0,0);
      this_00 = _h;
      local_2f8 = operator+(&br_pos,&local_2f0);
      xoffset.capacity = (size_t *)operator-(&local_2e0,&local_2f0);
      ImDrawList::AddRectFilled(this_00,&local_2f8,(ImVec2 *)&xoffset.capacity,0xffffffff,0.0,0);
      draw_bar.draw_list = (ImDrawList **)&ul_pos.y;
      xoffset.w = (f32 *)&local_2f0;
      xoffset.margin = (ImVec2 *)&total_ticks;
      local_340 = (undefined1  [8])&br_pos;
      draw_bar.ul_pos = &local_2f0;
      draw_bar.margin = (ImVec2 *)&draw_bar.draw_list;
      draw_bar.xoffset = (anon_class_24_3_8a65b60c *)&ul_pos;
      draw_bar.h = &h;
      Tick::anon_class_40_5_a302e0d8::operator()
                ((anon_class_40_5_a302e0d8 *)local_340,rw_stats.capacity_bytes,
                 rw_stats.data_ranges[0],0xfff38bff);
      Tick::anon_class_40_5_a302e0d8::operator()
                ((anon_class_40_5_a302e0d8 *)local_340,rw_stats.data_ranges[1],
                 rw_stats.data_ranges[2],0xffac5eb5);
      Tick::anon_class_40_5_a302e0d8::operator()
                ((anon_class_40_5_a302e0d8 *)local_340,rw_stats.data_ranges[3],
                 rw_stats.info_ranges[0],0xff64ea54);
      Tick::anon_class_40_5_a302e0d8::operator()
                ((anon_class_40_5_a302e0d8 *)local_340,rw_stats.info_ranges[1],
                 rw_stats.info_ranges[2],0xff3eab32);
      ImVec2::ImVec2(&local_348,ul_pos.y,ul_pos.x);
      ImGui::Dummy(&local_348);
    }
    ImGui::End();
  }
  return;
}

Assistant:

void Debugger::RewindWindow::Tick() {
  if (!is_open) return;

  if (ImGui::Begin(Debugger::s_rewind_window_name, &is_open)) {
    bool rewinding = host_is_rewinding(d->host);
    if (ImGui::Checkbox("Rewind", &rewinding)) {
      if (rewinding) {
        d->BeginRewind();
      } else {
        d->EndRewind();
      }
    }

    if (rewinding) {
      Ticks cur_cy = emulator_get_ticks(d->e);
      Ticks oldest_cy = host_get_rewind_oldest_ticks(d->host);
      Ticks rel_cur_cy = cur_cy - oldest_cy;
      u32 range_fr = (host_newest_ticks(d->host) - oldest_cy) / PPU_FRAME_TICKS;

      // Frames.
      int frame = rel_cur_cy / PPU_FRAME_TICKS;

      ImGui::PushButtonRepeat(true);
      if (ImGui::Button("-1")) {
        --frame;
      }
      ImGui::SameLine();
      if (ImGui::Button("+1")) {
        ++frame;
      }
      ImGui::PopButtonRepeat();
      ImGui::SameLine();
      ImGui::SliderInt("Frames", &frame, 0, range_fr);

      frame = CLAMP(frame, 0, static_cast<int>(range_fr));

      // Ticks.
      int offset_cy = rel_cur_cy % PPU_FRAME_TICKS;
      bool reverse_step = false;

      ImGui::PushButtonRepeat(true);
      if (ImGui::Button("-I")) {
        offset_cy -= 28;
        reverse_step = true;
      }
      ImGui::SameLine();
      if (ImGui::Button("+I")) {
        offset_cy += 1;
      }
      ImGui::PopButtonRepeat();
      ImGui::SameLine();
      ImGui::SliderInt("Tick Offset", &offset_cy, 0, PPU_FRAME_TICKS - 1);

      Ticks rel_seek_cy = (Ticks)frame * PPU_FRAME_TICKS + offset_cy;

      if (rel_cur_cy != rel_seek_cy) {
        d->RewindTo(oldest_cy + rel_seek_cy);

        // Reverse stepping is tricky because we don't know how long the
        // previous instruction took. We can rewind by 28 ticks (longer than
        // any instruction or interrupt dispatch) and step forward until just
        // before the current tick. But since we don't know how long a step
        // will take, it's easier to just save state, step forward one
        // instruction too far, then load state and step just before it.
        if (reverse_step) {
          emulator_write_state(d->e, &reverse_step_save_state);
          int count = 0;
          for (; emulator_get_ticks(d->e) < cur_cy; ++count) {
            emulator_step(d->e);
          }

          emulator_read_state(d->e, &reverse_step_save_state);
          for (int i = 0; i < count - 1; ++i) {
            emulator_step(d->e);
          }
        }
      }
    }

    ImGui::Separator();
    JoypadStats joyp_stats = host_get_joypad_stats(d->host);
    RewindStats rw_stats = host_get_rewind_stats(d->host);
    size_t base = rw_stats.base_bytes;
    size_t diff = rw_stats.diff_bytes;
    size_t total = base + diff;
    size_t uncompressed = rw_stats.uncompressed_bytes;
    size_t used = rw_stats.used_bytes;
    size_t capacity = rw_stats.capacity_bytes;
    Ticks total_ticks = host_newest_ticks(d->host) - host_oldest_ticks(d->host);
    f64 sec = (f64)total_ticks / CPU_TICKS_PER_SECOND;

    ImGui::Text("joypad used/capacity: %s/%s",
                d->PrettySize(joyp_stats.used_bytes).c_str(),
                d->PrettySize(joyp_stats.capacity_bytes).c_str());

    ImGui::Text("rewind base/diff/total: %s/%s/%s (%.0f%%)",
                d->PrettySize(base).c_str(), d->PrettySize(diff).c_str(),
                d->PrettySize(total).c_str(), (f64)(total)*100 / uncompressed);
    ImGui::Text("rewind uncomp: %s", d->PrettySize(uncompressed).c_str());
    ImGui::Text("rewind used: %s/%s (%.0f%%)", d->PrettySize(used).c_str(),
                d->PrettySize(capacity).c_str(), (f64)used * 100 / capacity);
    ImGui::Text("rate: %s/sec %s/min %s/hr", d->PrettySize(total / sec).c_str(),
                d->PrettySize(total / sec * 60).c_str(),
                d->PrettySize(total / sec * 60 * 60).c_str());

    Ticks oldest = host_get_rewind_oldest_ticks(d->host);
    Ticks newest = host_get_rewind_newest_ticks(d->host);
    f64 range = (f64)(newest - oldest) / CPU_TICKS_PER_SECOND;
    ImGui::Text("range: [%" PRIu64 "..%" PRIu64 "] (%.0f sec)", oldest, newest,
                range);

    ImVec2 cursor = ImGui::GetCursorScreenPos();
    ImVec2 avail_size = ImGui::GetContentRegionAvail();
    ImDrawList* draw_list = ImGui::GetWindowDrawList();

    f32 w = avail_size.x, h = 64;
    ImVec2 ul_pos = cursor;
    ImVec2 br_pos = ul_pos + ImVec2(w, h);
    ImVec2 margin(4, 4);
    draw_list->AddRectFilled(ul_pos, br_pos, IM_COL32_BLACK);
    draw_list->AddRectFilled(ul_pos + margin, br_pos - margin, IM_COL32_WHITE);

    auto xoffset = [&](size_t x) -> f32 {
      return (f32)x * (w - margin.x * 2) / (f32)capacity;
    };

    auto draw_bar = [&](size_t l, size_t r, ImU32 col) {
      ImVec2 ul = ul_pos + margin + ImVec2(xoffset(l), 0);
      ImVec2 br = ul_pos + margin + ImVec2(xoffset(r), h - margin.y * 2);
      draw_list->AddRectFilled(ul, br, col);
    };

    draw_bar(rw_stats.data_ranges[0], rw_stats.data_ranges[1], 0xfff38bff);
    draw_bar(rw_stats.data_ranges[2], rw_stats.data_ranges[3], 0xffac5eb5);
    draw_bar(rw_stats.info_ranges[0], rw_stats.info_ranges[1], 0xff64ea54);
    draw_bar(rw_stats.info_ranges[2], rw_stats.info_ranges[3], 0xff3eab32);
    ImGui::Dummy(ImVec2(w, h));
  }
  ImGui::End();
}